

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlAttributePtrWrap(xmlAttributePtr attr)

{
  PyObject *ret;
  xmlAttributePtr attr_local;
  
  if (attr == (xmlAttributePtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    attr_local = (xmlAttributePtr)&_Py_NoneStruct;
  }
  else {
    attr_local = (xmlAttributePtr)PyCapsule_New(attr,"xmlAttributePtr",0);
  }
  return (PyObject *)attr_local;
}

Assistant:

PyObject *
libxml_xmlAttributePtrWrap(xmlAttributePtr attr)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlAttributePtrWrap: attr = %p\n", attr);
#endif
    if (attr == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PyCapsule_New((void *) attr, (char *) "xmlAttributePtr", NULL);
    return (ret);
}